

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

int __thiscall
gl4cts::SparseTexture2CommitmentTestCase::init
          (SparseTexture2CommitmentTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  reference pvVar2;
  int local_18 [2];
  
  SparseTextureCommitmentTestCase::init(&this->super_SparseTextureCommitmentTestCase,ctx);
  this_00 = &(this->super_SparseTextureCommitmentTestCase).mSupportedTargets;
  piVar1 = (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish !=
      piVar1) {
    (this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = piVar1
    ;
  }
  local_18[1] = 0x9100;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,local_18 + 1);
  local_18[0] = 0x9102;
  pvVar2 = std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,local_18);
  return (int)pvVar2;
}

Assistant:

void SparseTexture2CommitmentTestCase::init()
{
	SparseTextureCommitmentTestCase::init();

	//Verify all targets once again and multisample targets as it was added in ARB_sparse_texture2 extension
	mSupportedTargets.clear();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}